

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigReference.cpp
# Opt level: O2

void deqp::egl::chooseConfigReference
               (Library *egl,EGLDisplay display,vector<void_*,_std::allocator<void_*>_> *dst,
               vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
               *attributes)

{
  pointer __first;
  pointer __last;
  bool yuvPlaneBppSpecified;
  size_t ndx;
  ulong uVar1;
  long lVar2;
  size_t ndx_1;
  vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_> filteredConfigs;
  vector<void_*,_std::allocator<void_*>_> eglConfigs;
  vector<eglu::ConfigInfo,_std::allocator<eglu::ConfigInfo>_> configInfos;
  vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_> configs;
  ConfigFilter configFilter;
  undefined1 local_166 [2];
  undefined1 local_164 [4];
  _Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_> local_160;
  _Vector_base<void_*,_std::allocator<void_*>_> local_148;
  CompareConfigs local_12f;
  _Vector_base<eglu::ConfigInfo,_std::allocator<eglu::ConfigInfo>_> local_128;
  vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> *local_110;
  _Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_> local_108;
  _Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
  local_e8;
  SurfaceConfig local_d0;
  
  eglu::getConfigs((vector<void_*,_std::allocator<void_*>_> *)&local_148,egl,display);
  local_128._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<eglu::ConfigInfo,_std::allocator<eglu::ConfigInfo>_>::resize
            ((vector<eglu::ConfigInfo,_std::allocator<eglu::ConfigInfo>_> *)&local_128,
             (long)local_148._M_impl.super__Vector_impl_data._M_finish -
             (long)local_148._M_impl.super__Vector_impl_data._M_start >> 3);
  lVar2 = 0;
  uVar1 = 0;
  while( true ) {
    if ((ulong)((long)local_148._M_impl.super__Vector_impl_data._M_finish -
                (long)local_148._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar1) break;
    eglu::queryCoreConfigInfo
              (egl,display,local_148._M_impl.super__Vector_impl_data._M_start[uVar1],
               (ConfigInfo *)
               ((long)&(local_128._M_impl.super__Vector_impl_data._M_start)->bufferSize + lVar2));
    eglu::queryExtConfigInfo
              (egl,display,local_148._M_impl.super__Vector_impl_data._M_start[uVar1],
               (ConfigInfo *)
               ((long)&(local_128._M_impl.super__Vector_impl_data._M_start)->bufferSize + lVar2));
    uVar1 = uVar1 + 1;
    lVar2 = lVar2 + 0x98;
  }
  local_108._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar2 = 0;
  local_110 = attributes;
  for (uVar1 = 0;
      uVar1 < (ulong)((long)local_148._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_148._M_impl.super__Vector_impl_data._M_start >> 3);
      uVar1 = uVar1 + 1) {
    local_d0.m_config = local_148._M_impl.super__Vector_impl_data._M_start[uVar1];
    memcpy(&local_d0.m_info,
           (void *)((long)&(local_128._M_impl.super__Vector_impl_data._M_start)->bufferSize + lVar2)
           ,0x98);
    std::vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>::
    emplace_back<deqp::egl::SurfaceConfig>
              ((vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_> *)
               &local_108,&local_d0);
    lVar2 = lVar2 + 0x98;
  }
  SurfaceConfig::getDefaultRules();
  std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>::vector
            ((vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> *
             )&local_e8,local_110);
  ConfigFilter::setValues
            ((ConfigFilter *)&local_d0,
             (vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> *
             )&local_e8);
  std::_Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>::
  ~_Vector_base(&local_e8);
  ConfigFilter::filter
            ((vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_> *)
             &local_160,(ConfigFilter *)&local_d0,
             (vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_> *)
             &local_108);
  __last = local_160._M_impl.super__Vector_impl_data._M_finish;
  __first = local_160._M_impl.super__Vector_impl_data._M_start;
  ConfigFilter::getSpecifiedRGBColors((ConfigFilter *)local_164);
  ConfigFilter::getSpecifiedLuminanceColors((ConfigFilter *)local_166);
  yuvPlaneBppSpecified = ConfigFilter::isYuvPlaneBppSpecified((ConfigFilter *)&local_d0);
  CompareConfigs::CompareConfigs
            (&local_12f,(BVec4 *)local_164,(BVec2 *)local_166,yuvPlaneBppSpecified);
  std::
  sort<__gnu_cxx::__normal_iterator<deqp::egl::SurfaceConfig*,std::vector<deqp::egl::SurfaceConfig,std::allocator<deqp::egl::SurfaceConfig>>>,deqp::egl::CompareConfigs>
            ((__normal_iterator<deqp::egl::SurfaceConfig_*,_std::vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>_>
              )__first,
             (__normal_iterator<deqp::egl::SurfaceConfig_*,_std::vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>_>
              )__last,&local_12f);
  std::vector<void_*,_std::allocator<void_*>_>::resize
            (dst,((long)local_160._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_160._M_impl.super__Vector_impl_data._M_start) / 0xa0);
  lVar2 = 0;
  for (uVar1 = 0;
      uVar1 < (ulong)(((long)local_160._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_160._M_impl.super__Vector_impl_data._M_start) / 0xa0);
      uVar1 = uVar1 + 1) {
    (dst->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.super__Vector_impl_data.
    _M_start[uVar1] =
         *(void **)((long)&(local_160._M_impl.super__Vector_impl_data._M_start)->m_config + lVar2);
    lVar2 = lVar2 + 0xa0;
  }
  std::_Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>::
  ~_Vector_base(&local_160);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_deqp::egl::AttribRule>,_std::_Select1st<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_deqp::egl::AttribRule>,_std::_Select1st<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
               *)&local_d0);
  std::_Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>::
  ~_Vector_base(&local_108);
  std::_Vector_base<eglu::ConfigInfo,_std::allocator<eglu::ConfigInfo>_>::~_Vector_base(&local_128);
  std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base(&local_148);
  return;
}

Assistant:

void chooseConfigReference (const Library& egl, EGLDisplay display, std::vector<EGLConfig>& dst, const std::vector<std::pair<EGLenum, EGLint> >& attributes)
{
	// Get all configs
	std::vector<EGLConfig> eglConfigs = eglu::getConfigs(egl, display);

	// Config infos - including extension attributes
	std::vector<ConfigInfo> configInfos;
	configInfos.resize(eglConfigs.size());

	for (size_t ndx = 0; ndx < eglConfigs.size(); ndx++)
	{
		eglu::queryCoreConfigInfo(egl, display, eglConfigs[ndx], &configInfos[ndx]);
		eglu::queryExtConfigInfo(egl, display, eglConfigs[ndx], &configInfos[ndx]);
	}

	// Pair configs with info
	std::vector<SurfaceConfig> configs;
	for (size_t ndx = 0; ndx < eglConfigs.size(); ndx++)
		configs.push_back(SurfaceConfig(eglConfigs[ndx], configInfos[ndx]));

	// Filter configs
	ConfigFilter configFilter;
	configFilter.setValues(attributes);

	std::vector<SurfaceConfig> filteredConfigs = configFilter.filter(configs);

	// Sort configs
	std::sort(filteredConfigs.begin(), filteredConfigs.end(), CompareConfigs(configFilter.getSpecifiedRGBColors(), configFilter.getSpecifiedLuminanceColors(), configFilter.isYuvPlaneBppSpecified()));

	// Write to dst list
	dst.resize(filteredConfigs.size());
	for (size_t ndx = 0; ndx < filteredConfigs.size(); ndx++)
		dst[ndx] = filteredConfigs[ndx].getEglConfig();
}